

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_StageSetup(ARKodeMem ark_mem,int implicit)

{
  uint uVar1;
  ARKodeARKStepMem step_mem;
  N_Vector *pp_Var2;
  long lVar3;
  sunrealtype *psVar4;
  sunrealtype *psVar5;
  sunrealtype *psVar6;
  int iVar7;
  int iVar8;
  uint jmax;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  sunrealtype sVar15;
  int local_3c;
  sunrealtype *local_38;
  uint uVar9;
  
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeARKStepMem)0x0) {
    iVar7 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0xbe6,"arkStep_StageSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    uVar1 = step_mem->istage;
    uVar12 = (ulong)uVar1;
    lVar13 = (long)(int)uVar1;
    local_38 = step_mem->cvals;
    pp_Var2 = step_mem->Xvecs;
    if (implicit == 0) {
      local_3c = 0;
    }
    else {
      dVar14 = ark_mem->h * step_mem->Bi->A[lVar13][lVar13];
      step_mem->gamma = dVar14;
      if (ark_mem->firststage == 0) {
        sVar15 = dVar14 / step_mem->gammap;
      }
      else {
        step_mem->gammap = dVar14;
        sVar15 = 1.0;
      }
      step_mem->gamrat = sVar15;
      local_3c = 0;
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ark_mem->yn,step_mem->zpred,step_mem->sdata
                  );
      *local_38 = 1.0;
      *pp_Var2 = step_mem->sdata;
      local_3c = 1;
      if ((implicit != 0) && (step_mem->mass_type == 1)) {
        N_VScale(0x3ff0000000000000,step_mem->sdata,ark_mem->tempv1);
        iVar7 = (*step_mem->mmult)(ark_mem,ark_mem->tempv1,step_mem->sdata);
        if (iVar7 != 0) {
          return -0x12;
        }
      }
    }
    psVar6 = local_38;
    if ((step_mem->explicit != 0) && (0 < (int)uVar1)) {
      uVar10 = 0;
      do {
        local_38[(long)local_3c + uVar10] = ark_mem->h * step_mem->Be->A[uVar12][uVar10];
        pp_Var2[(long)local_3c + uVar10] = step_mem->Fe[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      local_3c = (int)uVar10 + local_3c;
    }
    if ((step_mem->implicit != 0) && (0 < (int)uVar1)) {
      lVar11 = 0;
      do {
        local_38[local_3c + lVar11] = ark_mem->h * step_mem->Bi->A[uVar12][lVar11];
        pp_Var2[local_3c + lVar11] = step_mem->Fi[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar13 != lVar11);
      local_3c = (int)lVar11 + local_3c;
    }
    lVar11 = 0x70;
    if ((step_mem->expforcing != 0) || (lVar11 = 0x78, step_mem->impforcing != 0)) {
      uVar9 = (uint)(step_mem->expforcing == 0);
      jmax = uVar9 + uVar1;
      if (jmax != 0 && SCARRY4(uVar9,uVar1) == (int)jmax < 0) {
        lVar11 = *(long *)((long)&step_mem->fe + lVar11);
        lVar3 = *(long *)(lVar11 + 0x18);
        psVar4 = step_mem->stage_times;
        psVar5 = step_mem->stage_coefs;
        lVar13 = *(long *)(*(long *)(lVar11 + 0x10) + lVar13 * 8);
        uVar12 = 0;
        do {
          psVar4[uVar12] = *(double *)(lVar3 + uVar12 * 8) * ark_mem->h + ark_mem->tn;
          psVar5[uVar12] = ark_mem->h * *(double *)(lVar13 + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (jmax != uVar12);
      }
      arkStep_ApplyForcing(step_mem,step_mem->stage_times,step_mem->stage_coefs,jmax,&local_3c);
    }
    iVar8 = N_VLinearCombination(local_3c,psVar6,pp_Var2,step_mem->sdata);
    iVar7 = -0x1c;
    if (iVar8 == 0) {
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int arkStep_StageSetup(ARKodeMem ark_mem, sunbooleantype implicit)
{
  /* local data */
  ARKodeARKStepMem step_mem;
  int retval, i, j, jmax, nvec;
  sunrealtype* cj;
  sunrealtype** Aij;
  sunrealtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* Set shortcut to current stage index */
  i = step_mem->istage;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Update gamma if stage is implicit */
  if (implicit)
  {
    step_mem->gamma = ark_mem->h * step_mem->Bi->A[i][i];
    if (ark_mem->firststage) { step_mem->gammap = step_mem->gamma; }
    step_mem->gamrat = (ark_mem->firststage)
                         ? ONE
                         : step_mem->gamma /
                             step_mem->gammap; /* protect x/x != 1.0 */
  }

  /* If implicit, initialize sdata to yn - zpred (here: zpred = zp), and set
     first entries for eventual N_VLinearCombination call */
  nvec = 0;
  if (implicit)
  {
    N_VLinearSum(ONE, ark_mem->yn, -ONE, step_mem->zpred, step_mem->sdata);
    cvals[0] = ONE;
    Xvecs[0] = step_mem->sdata;
    nvec     = 1;
  }

  /* If implicit with fixed M!=I, update sdata with M*sdata */
  if (implicit && (step_mem->mass_type == MASS_FIXED))
  {
    N_VScale(ONE, step_mem->sdata, ark_mem->tempv1);
    retval = step_mem->mmult((void*)ark_mem, ark_mem->tempv1, step_mem->sdata);
    if (retval != ARK_SUCCESS) { return (ARK_MASSMULT_FAIL); }
  }

  /* Update sdata with prior stage information */
  if (step_mem->explicit)
  { /* Explicit pieces */
    for (j = 0; j < i; j++)
    {
      cvals[nvec] = ark_mem->h * step_mem->Be->A[i][j];
      Xvecs[nvec] = step_mem->Fe[j];
      nvec += 1;
    }
  }
  if (step_mem->implicit)
  { /* Implicit pieces */
    for (j = 0; j < i; j++)
    {
      cvals[nvec] = ark_mem->h * step_mem->Bi->A[i][j];
      Xvecs[nvec] = step_mem->Fi[j];
      nvec += 1;
    }
  }

  /* apply external polynomial (MRI) forcing (M = I required) */
  if (step_mem->expforcing || step_mem->impforcing)
  {
    if (step_mem->expforcing)
    {
      jmax = i;
      Aij  = step_mem->Be->A;
      cj   = step_mem->Be->c;
    }
    else
    {
      jmax = i + 1;
      Aij  = step_mem->Bi->A;
      cj   = step_mem->Bi->c;
    }

    for (j = 0; j < jmax; j++)
    {
      step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
      step_mem->stage_coefs[j] = ark_mem->h * Aij[i][j];
    }

    arkStep_ApplyForcing(step_mem, step_mem->stage_times, step_mem->stage_coefs,
                         jmax, &nvec);
  }

  /* call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* return with success */
  return (ARK_SUCCESS);
}